

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::IfConversion::GetIncomingValue
          (IfConversion *this,Instruction *phi,uint32_t predecessor)

{
  uint32_t id;
  DefUseManager *this_00;
  Instruction *pIVar1;
  uint32_t in_index;
  uint32_t predecessor_local;
  Instruction *phi_local;
  IfConversion *this_local;
  
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  id = opt::Instruction::GetSingleWordInOperand(phi,predecessor << 1);
  pIVar1 = analysis::DefUseManager::GetDef(this_00,id);
  return pIVar1;
}

Assistant:

Instruction* IfConversion::GetIncomingValue(Instruction* phi,
                                            uint32_t predecessor) {
  uint32_t in_index = 2 * predecessor;
  return get_def_use_mgr()->GetDef(phi->GetSingleWordInOperand(in_index));
}